

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::visitRefI31
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,RefI31 *curr
          )

{
  Shareability SVar1;
  HeapType local_88;
  undefined1 local_80 [8];
  Literal lit;
  Flow flow;
  
  visit((Flow *)&lit.type,this,curr->value);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + lit.type.id != 1) {
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    if (flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.
        super_IString.str._M_str != (char *)0x2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    local_88 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)59>).
                           super_Expression.type);
    SVar1 = HeapType::getShared(&local_88);
    Literal::Literal((Literal *)local_80,(Type)((ulong)(SVar1 == Shared) * 4 + 0x30));
    local_80._0_4_ = (uint)flow.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed | 0x80000000;
    Flow::Flow(__return_storage_ptr__,(Literal *)local_80);
    Literal::~Literal((Literal *)local_80);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = lit.type.id;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefI31(RefI31* curr) {
    NOTE_ENTER("RefI31");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    return Literal::makeI31(value.geti32(),
                            curr->type.getHeapType().getShared());
  }